

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_MaxPlayerAmmo(FParser *this)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  PClassAmmo *type;
  AInventory *pAVar8;
  undefined8 uVar9;
  PClass *pPVar10;
  ulong uVar11;
  bool bVar12;
  DVector3 local_48;
  
  if (this->t_argc < 2) {
    script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
    return;
  }
  uVar5 = T_GetPlayerNum(this->t_argv);
  if ((uVar5 != 0xffffffff) && (type = T_GetAmmo(this->t_argv + 1), type != (PClassAmmo *)0x0)) {
    uVar11 = (ulong)uVar5;
    if (2 < this->t_argc) {
      pAVar8 = AActor::FindInventory((AActor *)(&players)[uVar11 * 0x54],(PClassActor *)type,false);
      iVar6 = intvalue(this->t_argv + 2);
      iVar7 = 0;
      if (0 < iVar6) {
        iVar7 = iVar6;
      }
      if (pAVar8 == (AInventory *)0x0) {
        local_48.X = 0.0;
        local_48.Y = 0.0;
        local_48.Z = 0.0;
        pAVar8 = (AInventory *)AActor::StaticSpawn((PClassActor *)type,&local_48,NO_REPLACE,false);
        pAVar8->Amount = 0;
        (*(pAVar8->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x29])
                  (pAVar8,(&players)[uVar11 * 0x54]);
      }
      pAVar8->MaxAmount = iVar7;
      lVar1 = (&players)[uVar11 * 0x54];
      puVar2 = *(undefined8 **)(lVar1 + 0x3b0);
      pPVar4 = ABackpackItem::RegistrationInfo.MyClass;
      if ((puVar2 != (undefined8 *)0x0) && ((*(byte *)(puVar2 + 4) & 0x20) != 0)) {
        *(undefined8 *)(lVar1 + 0x3b0) = 0;
        puVar2 = (undefined8 *)0x0;
        pPVar4 = ABackpackItem::RegistrationInfo.MyClass;
      }
      while (puVar3 = puVar2, ABackpackItem::RegistrationInfo.MyClass = pPVar4,
            puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar9 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar9;
        }
        pPVar10 = (PClass *)puVar3[1];
        bVar12 = pPVar10 != (PClass *)0x0;
        if (pPVar10 != pPVar4 && bVar12) {
          do {
            pPVar10 = pPVar10->ParentClass;
            bVar12 = pPVar10 != (PClass *)0x0;
            if (pPVar10 == pPVar4) break;
          } while (pPVar10 != (PClass *)0x0);
        }
        if (bVar12) {
          if (this->t_argc < 4) {
            iVar7 = iVar7 * 2;
          }
          else {
            iVar7 = intvalue(this->t_argv + 3);
          }
          break;
        }
        puVar2 = (undefined8 *)puVar3[0x76];
        pPVar4 = ABackpackItem::RegistrationInfo.MyClass;
        if ((puVar2 != (undefined8 *)0x0) && ((*(byte *)(puVar2 + 4) & 0x20) != 0)) {
          puVar3[0x76] = 0;
          puVar2 = (undefined8 *)0x0;
          pPVar4 = ABackpackItem::RegistrationInfo.MyClass;
        }
      }
      *(int *)&pAVar8[1].super_AActor.super_DThinker.super_DObject._vptr_DObject = iVar7;
    }
    (this->t_return).type = 1;
    pAVar8 = AActor::FindInventory((AActor *)(&players)[uVar11 * 0x54],(PClassActor *)type,false);
    if (pAVar8 == (AInventory *)0x0) {
      pAVar8 = (AInventory *)(type->super_PClassInventory).super_PClassActor.super_PClass.Defaults;
    }
    (this->t_return).value.i = pAVar8->MaxAmount;
  }
  return;
}

Assistant:

void FParser::SF_MaxPlayerAmmo()
{
	int playernum, amount;
	PClassAmmo * ammotype;

	if (CheckArgs(2))
	{
		playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum==-1) return;

		ammotype=T_GetAmmo(t_argv[1]);
		if (!ammotype) return;

		if(t_argc == 2)
		{
		}
		else if(t_argc >= 3)
		{
			AAmmo * iammo = (AAmmo*)players[playernum].mo->FindInventory(ammotype);
			amount = intvalue(t_argv[2]);
			if(amount < 0) amount = 0;
			if (!iammo) 
			{
				iammo = static_cast<AAmmo *>(Spawn (ammotype));
				iammo->Amount = 0;
				iammo->AttachToOwner (players[playernum].mo);
			}
			iammo->MaxAmount = amount;


			for (AInventory *item = players[playernum].mo->Inventory; item != NULL; item = item->Inventory)
			{
				if (item->IsKindOf(RUNTIME_CLASS(ABackpackItem)))
				{
					if (t_argc>=4) amount = intvalue(t_argv[3]);
					else amount*=2;
					break;
				}
			}
			iammo->BackpackMaxAmount=amount;
		}

		t_return.type = svt_int;
		AInventory * iammo = players[playernum].mo->FindInventory(ammotype);
		if (iammo) t_return.value.i = iammo->MaxAmount;
		else t_return.value.i = ((AAmmo*)GetDefaultByType(ammotype))->MaxAmount;
	}
}